

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldAccessor::Set<long,long>
          (RepeatedFieldAccessor *this,Field *data,int index,long *value)

{
  long local_30;
  ActualType tmp;
  long *value_local;
  Field *pFStack_18;
  int index_local;
  Field *data_local;
  RepeatedFieldAccessor *this_local;
  
  local_30 = *value;
  tmp = (ActualType)value;
  value_local._4_4_ = index;
  pFStack_18 = data;
  data_local = this;
  (**(code **)(*(long *)this + 0x20))(this,data,index,&local_30);
  return;
}

Assistant:

void Set(Field* PROTOBUF_NONNULL data, int index,
           const ValueType& value) const {
    typedef typename RefTypeTraits<T>::AccessorValueType ActualType;
    // In this RepeatedFieldAccessor interface we pass/return data using
    // raw pointers. Type of the data these raw pointers point to should
    // be ActualType. Here we have a ValueType object and want a ActualType
    // pointer. We can't cast a ValueType pointer to an ActualType pointer
    // directly because their type might be different (for enums ValueType
    // may be a generated enum type while ActualType is int32_t). To be safe
    // we make a copy to get a temporary ActualType object and use it.
    ActualType tmp = static_cast<ActualType>(value);
    Set(data, index, static_cast<const Value*>(&tmp));
  }